

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_pool.cpp
# Opt level: O3

shared_ptr<duckdb::BlockHandle,_true> __thiscall
duckdb::BufferEvictionNode::TryGetBlockHandle(BufferEvictionNode *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  type this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  long in_RSI;
  shared_ptr<duckdb::BlockHandle,_true> sVar4;
  shared_ptr<duckdb::BlockHandle,_true> handle_p;
  shared_ptr<duckdb::BlockHandle,_true> local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  sVar4 = weak_ptr<duckdb::BlockHandle,_true>::lock
                    ((weak_ptr<duckdb::BlockHandle,_true> *)&local_28);
  _Var3._M_pi = sVar4.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if (local_28.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    this_00 = shared_ptr<duckdb::BlockHandle,_true>::operator*(&local_28);
    _Var3._M_pi = extraout_RDX;
    if (*(__int_type *)(in_RSI + 0x10) ==
        (this_00->eviction_seq_num).super___atomic_base<unsigned_long>._M_i) {
      bVar2 = BlockHandle::CanUnload(this_00);
      _Var1._M_pi = local_28.internal.
                    super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
      _Var3._M_pi = extraout_RDX_00;
      if (bVar2) {
        local_28.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (this->handle).internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = local_28.internal.
                 super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (this->handle).internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = _Var1._M_pi;
        local_28.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)0x0;
        goto LAB_00558718;
      }
    }
  }
  (this->handle).internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->handle).internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_00558718:
  if (local_28.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    _Var3._M_pi = extraout_RDX_01;
  }
  sVar4.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  sVar4.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::BlockHandle,_true>)
         sVar4.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<BlockHandle> BufferEvictionNode::TryGetBlockHandle() {
	auto handle_p = handle.lock();
	if (!handle_p) {
		// BlockHandle has been destroyed
		return nullptr;
	}
	if (!CanUnload(*handle_p)) {
		// handle was used in between
		return nullptr;
	}
	// this is the latest node in the queue with this handle
	return handle_p;
}